

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

string * __thiscall
embree::SceneGraphFlattener::makeUniqueID
          (string *__return_storage_ptr__,SceneGraphFlattener *this,string *id)

{
  int iVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type_conflict *pmVar4;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = std::operator==(id,"");
  if (bVar2) {
    std::__cxx11::string::assign((char *)id);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->unique_id)._M_t,id);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->unique_id,id);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->unique_id)._M_t._M_impl.super__Rb_tree_header) {
    *pmVar4 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)id);
  }
  else {
    iVar1 = *pmVar4;
    *pmVar4 = (mapped_type_conflict)((long)iVar1 + 1);
    std::operator+(&local_48,id,"_");
    std::__cxx11::to_string(&sStack_68,(long)iVar1 + 1);
    std::operator+(__return_storage_ptr__,&local_48,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeUniqueID(std::string id) 
    {
      if (id == "") id = "camera";
      std::map<std::string,int>::iterator i = unique_id.find(id);
      if (i == unique_id.end()) {
        unique_id[id] = 0;
        return id;
      }
      else {
        int n = ++unique_id[id];
        return id + "_" + toString(n);
      }
    }